

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_vertical_14_quad_sse2
               (uchar *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  unkbyte9 Var27;
  unkbyte10 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [12];
  undefined1 auVar31 [13];
  undefined1 auVar32 [12];
  undefined1 auVar33 [11];
  undefined1 auVar34 [12];
  undefined1 auVar35 [13];
  undefined1 auVar36 [16];
  undefined1 auVar37 [11];
  undefined1 auVar38 [12];
  undefined1 auVar39 [13];
  undefined1 auVar40 [12];
  undefined1 auVar41 [11];
  undefined1 auVar42 [12];
  undefined1 auVar43 [13];
  undefined1 auVar44 [16];
  undefined1 auVar45 [11];
  undefined1 auVar46 [12];
  undefined1 auVar47 [13];
  undefined1 auVar48 [16];
  undefined1 auVar49 [12];
  undefined1 auVar50 [11];
  undefined1 auVar51 [12];
  undefined1 auVar52 [13];
  undefined1 auVar53 [16];
  undefined1 auVar54 [11];
  undefined1 auVar55 [12];
  undefined1 auVar56 [13];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  undefined1 auVar59 [11];
  undefined1 auVar60 [12];
  undefined1 auVar61 [13];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  unkbyte10 Var64;
  undefined1 auVar65 [12];
  unkbyte10 Var66;
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  unkbyte10 Var74;
  undefined1 auVar75 [14];
  undefined1 auVar76 [12];
  undefined1 auVar77 [14];
  undefined1 auVar78 [12];
  undefined1 auVar79 [14];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [14];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [12];
  undefined1 auVar91 [14];
  undefined1 auVar92 [12];
  undefined1 auVar93 [14];
  undefined1 auVar94 [12];
  unkbyte10 Var95;
  undefined1 auVar96 [12];
  undefined1 auVar97 [14];
  undefined1 auVar98 [12];
  undefined1 auVar99 [14];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [14];
  undefined1 auVar107 [12];
  undefined1 auVar108 [14];
  undefined1 auVar109 [12];
  undefined1 auVar110 [14];
  undefined1 auVar111 [12];
  undefined1 auVar112 [14];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [14];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [14];
  undefined1 auVar119 [12];
  undefined1 auVar120 [14];
  undefined1 auVar121 [12];
  undefined1 auVar122 [12];
  undefined1 auVar123 [14];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [14];
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  unkbyte10 Var131;
  undefined1 auVar132 [12];
  unkbyte10 Var133;
  undefined1 auVar134 [12];
  undefined6 uVar135;
  long lVar136;
  long lVar137;
  undefined4 uVar138;
  undefined4 uVar139;
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined1 auVar158 [16];
  undefined4 uVar167;
  undefined4 uVar168;
  undefined1 auVar169 [12];
  undefined1 uVar207;
  undefined1 uVar208;
  undefined1 uVar209;
  undefined1 uVar210;
  undefined1 uVar211;
  undefined1 uVar213;
  undefined1 uVar214;
  undefined1 uVar215;
  undefined1 uVar216;
  undefined1 uVar217;
  undefined1 uVar218;
  undefined1 uVar219;
  undefined1 uVar220;
  undefined1 uVar221;
  undefined1 uVar222;
  undefined1 uVar224;
  undefined1 uVar225;
  undefined1 auVar172 [16];
  undefined1 auVar180 [16];
  undefined1 auVar189 [16];
  undefined1 auVar198 [16];
  undefined4 uVar226;
  undefined1 auVar228 [12];
  undefined1 auVar229 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar264 [16];
  undefined1 uVar293;
  undefined1 uVar294;
  undefined1 auVar272 [16];
  undefined1 auVar279 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar292 [16];
  undefined2 uVar295;
  undefined1 uVar322;
  undefined1 uVar323;
  undefined1 uVar324;
  undefined1 uVar325;
  undefined1 uVar326;
  undefined1 uVar327;
  undefined1 auVar303 [16];
  undefined1 auVar310 [16];
  undefined1 auVar315 [16];
  undefined4 uVar328;
  undefined1 auVar329 [12];
  undefined1 auVar331 [12];
  undefined1 uVar367;
  undefined1 uVar369;
  undefined1 uVar370;
  undefined1 uVar372;
  undefined1 uVar373;
  undefined1 uVar375;
  undefined1 uVar376;
  undefined1 uVar378;
  undefined1 uVar379;
  undefined1 auVar332 [16];
  undefined1 auVar340 [16];
  undefined1 auVar349 [16];
  undefined1 auVar358 [16];
  undefined1 auVar381 [16];
  undefined1 auVar384 [16];
  undefined1 auVar388 [16];
  undefined1 auVar392 [16];
  undefined1 auVar399 [16];
  undefined1 auVar406 [16];
  undefined1 auVar413 [16];
  undefined1 uVar449;
  undefined1 uVar450;
  undefined1 uVar452;
  undefined1 uVar454;
  undefined1 uVar456;
  undefined1 auVar424 [16];
  undefined1 auVar431 [16];
  undefined1 auVar438 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined8 uVar458;
  undefined1 auVar459 [16];
  undefined1 auVar462 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar470 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar477 [16];
  undefined1 auVar481 [16];
  undefined1 auVar488 [16];
  undefined1 uVar504;
  undefined1 uVar505;
  undefined1 uVar506;
  undefined1 uVar507;
  undefined1 auVar492 [16];
  undefined1 auVar495 [16];
  undefined1 auVar498 [16];
  undefined1 auVar501 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  uchar t_dst [256];
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar140 [12];
  undefined1 auVar159 [16];
  undefined1 auVar141 [12];
  undefined1 auVar151 [16];
  undefined1 auVar160 [16];
  undefined1 auVar152 [16];
  undefined1 auVar161 [16];
  undefined1 auVar153 [16];
  undefined1 auVar162 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar155 [16];
  undefined1 auVar165 [16];
  undefined1 auVar164 [16];
  undefined1 auVar156 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar170 [12];
  undefined1 auVar199 [16];
  undefined1 auVar171 [12];
  undefined1 auVar191 [16];
  undefined1 auVar200 [16];
  undefined1 auVar192 [16];
  undefined1 auVar201 [16];
  undefined1 auVar193 [16];
  undefined1 auVar202 [16];
  undefined1 auVar188 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar195 [16];
  undefined1 auVar205 [16];
  undefined1 auVar204 [16];
  undefined1 auVar196 [16];
  undefined1 uVar212;
  undefined1 uVar223;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar256 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar227 [12];
  undefined1 auVar247 [16];
  undefined1 auVar257 [16];
  undefined1 auVar248 [16];
  undefined1 auVar258 [16];
  undefined1 auVar249 [16];
  undefined1 auVar259 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar251 [16];
  undefined1 auVar262 [16];
  undefined1 auVar261 [16];
  undefined1 auVar252 [16];
  undefined1 uVar265;
  undefined1 uVar266;
  undefined1 uVar267;
  undefined1 uVar268;
  undefined1 uVar269;
  undefined1 uVar270;
  undefined1 uVar271;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar286 [16];
  undefined1 auVar280 [16];
  undefined1 auVar287 [16];
  undefined1 auVar281 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar282 [16];
  undefined1 auVar291 [16];
  undefined1 auVar290 [16];
  undefined1 auVar283 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar316 [16];
  undefined1 auVar311 [16];
  undefined1 auVar317 [16];
  undefined1 auVar312 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar313 [16];
  undefined1 auVar321 [16];
  undefined1 auVar320 [16];
  undefined1 auVar314 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar350 [16];
  undefined1 auVar330 [12];
  undefined1 auVar359 [16];
  undefined1 auVar351 [16];
  undefined1 auVar360 [16];
  undefined1 auVar352 [16];
  undefined1 auVar361 [16];
  undefined1 auVar353 [16];
  undefined1 auVar362 [16];
  undefined1 auVar348 [16];
  undefined1 auVar354 [16];
  undefined1 auVar357 [16];
  undefined1 auVar363 [16];
  undefined1 auVar366 [16];
  undefined1 auVar355 [16];
  undefined1 auVar365 [16];
  undefined1 auVar364 [16];
  undefined1 auVar356 [16];
  undefined1 uVar368;
  undefined1 uVar371;
  undefined1 uVar374;
  undefined1 uVar377;
  undefined1 uVar380;
  undefined1 auVar385 [16];
  undefined1 auVar389 [16];
  undefined1 auVar382 [16];
  undefined1 auVar386 [16];
  undefined1 auVar390 [16];
  undefined1 auVar383 [16];
  undefined1 auVar387 [16];
  undefined1 auVar391 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar407 [16];
  undefined1 auVar414 [16];
  undefined1 auVar408 [16];
  undefined1 auVar415 [16];
  undefined1 auVar409 [16];
  undefined1 auVar416 [16];
  undefined1 auVar410 [16];
  undefined1 auVar417 [16];
  undefined1 auVar411 [16];
  undefined1 auVar419 [16];
  undefined1 auVar418 [16];
  undefined1 auVar412 [16];
  undefined1 uVar420;
  undefined1 uVar421;
  undefined1 uVar422;
  undefined1 uVar423;
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar443 [16];
  undefined1 auVar439 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar440 [16];
  undefined1 auVar446 [16];
  undefined1 auVar448 [16];
  undefined1 auVar447 [16];
  undefined1 uVar451;
  undefined1 uVar453;
  undefined1 uVar455;
  undefined1 uVar457;
  undefined1 auVar467 [16];
  undefined1 auVar460 [16];
  undefined1 auVar463 [16];
  undefined1 auVar468 [16];
  undefined1 auVar471 [16];
  undefined1 auVar461 [16];
  undefined1 auVar464 [16];
  undefined1 auVar469 [16];
  undefined1 auVar472 [16];
  undefined1 auVar478 [16];
  undefined1 auVar489 [16];
  undefined1 auVar482 [16];
  undefined1 auVar475 [16];
  undefined1 auVar479 [16];
  undefined1 auVar483 [16];
  undefined1 auVar490 [16];
  undefined1 auVar484 [16];
  undefined1 auVar476 [16];
  undefined1 auVar480 [16];
  undefined1 auVar485 [16];
  undefined1 auVar491 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar493 [16];
  undefined1 auVar496 [16];
  undefined1 auVar499 [16];
  undefined1 auVar502 [16];
  undefined1 auVar494 [16];
  undefined1 auVar497 [16];
  undefined1 auVar500 [16];
  undefined1 auVar503 [16];
  
  lVar137 = (long)pitch;
  lVar136 = lVar137 * 8 + -8;
  uVar2 = *(undefined8 *)(s + -8);
  uVar3 = *(undefined8 *)(s + lVar137 + -8);
  uVar217 = (undefined1)((ulong)uVar3 >> 0x28);
  uVar207 = (undefined1)((ulong)uVar3 >> 8);
  lVar24 = lVar137 * 6;
  uVar4 = *(undefined8 *)(s + lVar137 * 2 + -8);
  lVar22 = lVar137 * 3;
  uVar5 = *(undefined8 *)(s + lVar22 + -8);
  uVar218 = (undefined1)((ulong)uVar5 >> 0x28);
  uVar294 = (undefined1)((ulong)uVar4 >> 0x28);
  uVar208 = (undefined1)((ulong)uVar5 >> 8);
  uVar293 = (undefined1)((ulong)uVar4 >> 8);
  uVar6 = *(ulong *)(s + lVar137 * 4 + -8);
  lVar23 = lVar137 * 5;
  uVar7 = *(undefined8 *)(s + lVar23 + -8);
  uVar224 = (undefined1)((ulong)uVar7 >> 0x38);
  uVar271 = (undefined1)(uVar6 >> 0x38);
  auVar236._8_6_ = 0;
  auVar236._0_8_ = uVar6;
  auVar236[0xe] = uVar271;
  auVar236[0xf] = uVar224;
  uVar221 = (undefined1)((ulong)uVar7 >> 0x30);
  auVar235._14_2_ = auVar236._14_2_;
  auVar235._8_5_ = 0;
  auVar235._0_8_ = uVar6;
  auVar235[0xd] = uVar221;
  uVar270 = (undefined1)(uVar6 >> 0x30);
  auVar234._13_3_ = auVar235._13_3_;
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar6;
  auVar234[0xc] = uVar270;
  uVar219 = (undefined1)((ulong)uVar7 >> 0x28);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_3_ = 0;
  auVar233._0_8_ = uVar6;
  auVar233[0xb] = uVar219;
  uVar269 = (undefined1)(uVar6 >> 0x28);
  auVar232._11_5_ = auVar233._11_5_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar6;
  auVar232[10] = uVar269;
  uVar215 = (undefined1)((ulong)uVar7 >> 0x20);
  auVar231._10_6_ = auVar232._10_6_;
  auVar231[8] = 0;
  auVar231._0_8_ = uVar6;
  auVar231[9] = uVar215;
  uVar268 = (undefined1)(uVar6 >> 0x20);
  auVar230._9_7_ = auVar231._9_7_;
  auVar230[8] = uVar268;
  auVar230._0_8_ = uVar6;
  uVar213 = (undefined1)((ulong)uVar7 >> 0x18);
  uVar267 = (undefined1)(uVar6 >> 0x18);
  Var28 = CONCAT91(CONCAT81(auVar230._8_8_,uVar213),uVar267);
  uVar210 = (undefined1)((ulong)uVar7 >> 0x10);
  auVar62._2_10_ = Var28;
  auVar62[1] = uVar210;
  uVar266 = (undefined1)(uVar6 >> 0x10);
  auVar62[0] = uVar266;
  uVar209 = (undefined1)((ulong)uVar7 >> 8);
  auVar229._2_12_ = auVar62;
  auVar229[1] = uVar209;
  uVar265 = (undefined1)(uVar6 >> 8);
  auVar229[0] = uVar265;
  auVar229._14_2_ = 0;
  auVar229 = auVar229 << 0x10;
  uVar8 = *(ulong *)(s + lVar24 + -8);
  lVar25 = lVar137 * 7;
  uVar9 = *(undefined8 *)(s + lVar25 + -8);
  uVar225 = (undefined1)((ulong)uVar9 >> 0x38);
  uVar327 = (undefined1)(uVar8 >> 0x38);
  auVar302._8_6_ = 0;
  auVar302._0_8_ = uVar8;
  auVar302[0xe] = uVar327;
  auVar302[0xf] = uVar225;
  uVar222 = (undefined1)((ulong)uVar9 >> 0x30);
  auVar301._14_2_ = auVar302._14_2_;
  auVar301._8_5_ = 0;
  auVar301._0_8_ = uVar8;
  auVar301[0xd] = uVar222;
  uVar326 = (undefined1)(uVar8 >> 0x30);
  auVar300._13_3_ = auVar301._13_3_;
  auVar300._8_4_ = 0;
  auVar300._0_8_ = uVar8;
  auVar300[0xc] = uVar326;
  uVar220 = (undefined1)((ulong)uVar9 >> 0x28);
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._8_3_ = 0;
  auVar299._0_8_ = uVar8;
  auVar299[0xb] = uVar220;
  uVar325 = (undefined1)(uVar8 >> 0x28);
  auVar298._11_5_ = auVar299._11_5_;
  auVar298._8_2_ = 0;
  auVar298._0_8_ = uVar8;
  auVar298[10] = uVar325;
  uVar216 = (undefined1)((ulong)uVar9 >> 0x20);
  auVar297._10_6_ = auVar298._10_6_;
  auVar297[8] = 0;
  auVar297._0_8_ = uVar8;
  auVar297[9] = uVar216;
  uVar324 = (undefined1)(uVar8 >> 0x20);
  auVar296._9_7_ = auVar297._9_7_;
  auVar296[8] = uVar324;
  auVar296._0_8_ = uVar8;
  uVar214 = (undefined1)((ulong)uVar9 >> 0x18);
  uVar323 = (undefined1)(uVar8 >> 0x18);
  Var64 = CONCAT91(CONCAT81(auVar296._8_8_,uVar214),uVar323);
  uVar211 = (undefined1)((ulong)uVar9 >> 0x10);
  auVar63._2_10_ = Var64;
  auVar63[1] = uVar211;
  uVar322 = (undefined1)(uVar8 >> 0x10);
  auVar63[0] = uVar322;
  uVar295 = CONCAT11((char)uVar9,(char)uVar8);
  uVar10 = *(ulong *)(s + lVar137 * 8 + -8);
  uVar11 = *(undefined8 *)(s + lVar137 + lVar136);
  auVar179._8_6_ = 0;
  auVar179._0_8_ = uVar10;
  auVar179[0xe] = (char)(uVar10 >> 0x38);
  auVar179[0xf] = (char)((ulong)uVar11 >> 0x38);
  auVar178._14_2_ = auVar179._14_2_;
  auVar178._8_5_ = 0;
  auVar178._0_8_ = uVar10;
  uVar378 = (undefined1)((ulong)uVar11 >> 0x30);
  auVar178[0xd] = uVar378;
  uVar223 = (undefined1)(uVar10 >> 0x30);
  auVar177._13_3_ = auVar178._13_3_;
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar10;
  auVar177[0xc] = uVar223;
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_3_ = 0;
  auVar176._0_8_ = uVar10;
  uVar375 = (undefined1)((ulong)uVar11 >> 0x28);
  auVar176[0xb] = uVar375;
  auVar175._11_5_ = auVar176._11_5_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar10;
  auVar175[10] = (char)(uVar10 >> 0x28);
  auVar174._10_6_ = auVar175._10_6_;
  auVar174[8] = 0;
  auVar174._0_8_ = uVar10;
  uVar372 = (undefined1)((ulong)uVar11 >> 0x20);
  auVar174[9] = uVar372;
  auVar173._9_7_ = auVar174._9_7_;
  auVar173[8] = (char)(uVar10 >> 0x20);
  auVar173._0_8_ = uVar10;
  Var66 = CONCAT91(CONCAT81(auVar173._8_8_,(char)((ulong)uVar11 >> 0x18)),(char)(uVar10 >> 0x18));
  uVar369 = (undefined1)((ulong)uVar11 >> 0x10);
  auVar65._2_10_ = Var66;
  auVar65[1] = uVar369;
  uVar212 = (undefined1)(uVar10 >> 0x10);
  auVar65[0] = uVar212;
  uVar367 = (undefined1)((ulong)uVar11 >> 8);
  auVar126._1_12_ = auVar65;
  auVar126[0] = uVar367;
  auVar126[0xd] = 0;
  auVar172._0_2_ = CONCAT11((char)uVar11,(char)uVar10);
  auVar172._2_14_ = auVar126 << 8;
  auVar461._0_12_ = auVar229._0_12_;
  auVar461._12_2_ = (short)Var28;
  auVar461._14_2_ = (short)Var64;
  auVar460._12_4_ = auVar461._12_4_;
  auVar460._0_10_ = auVar229._0_10_;
  auVar460._10_2_ = auVar63._0_2_;
  auVar459._10_6_ = auVar460._10_6_;
  auVar459._0_8_ = auVar229._0_8_;
  auVar459._8_2_ = auVar62._0_2_;
  uVar12 = *(ulong *)(s + lVar137 * 2 + lVar136);
  uVar13 = *(undefined8 *)(s + lVar22 + lVar136);
  auVar398._8_6_ = 0;
  auVar398._0_8_ = uVar12;
  auVar398[0xe] = (char)(uVar12 >> 0x38);
  auVar398[0xf] = (char)((ulong)uVar13 >> 0x38);
  uVar379 = (undefined1)((ulong)uVar13 >> 0x30);
  auVar397._14_2_ = auVar398._14_2_;
  auVar397._8_5_ = 0;
  auVar397._0_8_ = uVar12;
  auVar397[0xd] = uVar379;
  uVar423 = (undefined1)(uVar12 >> 0x30);
  auVar396._13_3_ = auVar397._13_3_;
  auVar396._8_4_ = 0;
  auVar396._0_8_ = uVar12;
  auVar396[0xc] = uVar423;
  uVar376 = (undefined1)((ulong)uVar13 >> 0x28);
  auVar395._12_4_ = auVar396._12_4_;
  auVar395._8_3_ = 0;
  auVar395._0_8_ = uVar12;
  auVar395[0xb] = uVar376;
  uVar422 = (undefined1)(uVar12 >> 0x28);
  auVar394._11_5_ = auVar395._11_5_;
  auVar394._8_2_ = 0;
  auVar394._0_8_ = uVar12;
  auVar394[10] = uVar422;
  uVar373 = (undefined1)((ulong)uVar13 >> 0x20);
  auVar393._10_6_ = auVar394._10_6_;
  auVar393[8] = 0;
  auVar393._0_8_ = uVar12;
  auVar393[9] = uVar373;
  uVar421 = (undefined1)(uVar12 >> 0x20);
  auVar392._9_7_ = auVar393._9_7_;
  auVar392[8] = uVar421;
  auVar392._0_8_ = uVar12;
  Var28 = CONCAT91(CONCAT81(auVar392._8_8_,(char)((ulong)uVar13 >> 0x18)),(char)(uVar12 >> 0x18));
  uVar370 = (undefined1)((ulong)uVar13 >> 0x10);
  auVar67._2_10_ = Var28;
  auVar67[1] = uVar370;
  uVar420 = (undefined1)(uVar12 >> 0x10);
  auVar67[0] = uVar420;
  uVar14 = *(ulong *)(s + lVar137 * 4 + lVar136);
  uVar15 = *(undefined8 *)(s + lVar23 + lVar136);
  auVar339._8_6_ = 0;
  auVar339._0_8_ = uVar14;
  auVar339[0xe] = (char)(uVar14 >> 0x38);
  auVar339[0xf] = (char)((ulong)uVar15 >> 0x38);
  auVar338._14_2_ = auVar339._14_2_;
  auVar338._8_5_ = 0;
  auVar338._0_8_ = uVar14;
  uVar456 = (undefined1)((ulong)uVar15 >> 0x30);
  auVar338[0xd] = uVar456;
  uVar380 = (undefined1)(uVar14 >> 0x30);
  auVar337._13_3_ = auVar338._13_3_;
  auVar337._8_4_ = 0;
  auVar337._0_8_ = uVar14;
  auVar337[0xc] = uVar380;
  auVar336._12_4_ = auVar337._12_4_;
  auVar336._8_3_ = 0;
  auVar336._0_8_ = uVar14;
  uVar454 = (undefined1)((ulong)uVar15 >> 0x28);
  auVar336[0xb] = uVar454;
  uVar377 = (undefined1)(uVar14 >> 0x28);
  auVar335._11_5_ = auVar336._11_5_;
  auVar335._8_2_ = 0;
  auVar335._0_8_ = uVar14;
  auVar335[10] = uVar377;
  auVar334._10_6_ = auVar335._10_6_;
  auVar334[8] = 0;
  auVar334._0_8_ = uVar14;
  uVar452 = (undefined1)((ulong)uVar15 >> 0x20);
  auVar334[9] = uVar452;
  uVar374 = (undefined1)(uVar14 >> 0x20);
  auVar333._9_7_ = auVar334._9_7_;
  auVar333[8] = uVar374;
  auVar333._0_8_ = uVar14;
  Var64 = CONCAT91(CONCAT81(auVar333._8_8_,(char)((ulong)uVar15 >> 0x18)),(char)(uVar14 >> 0x18));
  uVar450 = (undefined1)((ulong)uVar15 >> 0x10);
  auVar68._2_10_ = Var64;
  auVar68[1] = uVar450;
  uVar371 = (undefined1)(uVar14 >> 0x10);
  auVar68[0] = uVar371;
  uVar449 = (undefined1)((ulong)uVar15 >> 8);
  auVar332._4_12_ = auVar68;
  auVar332[3] = uVar449;
  uVar368 = (undefined1)(uVar14 >> 8);
  auVar332[2] = uVar368;
  auVar332._0_2_ = CONCAT11((char)uVar15,(char)uVar14);
  auVar476._0_12_ = auVar172._0_12_;
  auVar476._12_2_ = (short)Var66;
  auVar476._14_2_ = (short)Var28;
  auVar475._12_4_ = auVar476._12_4_;
  auVar475._0_10_ = auVar172._0_10_;
  auVar475._10_2_ = auVar67._0_2_;
  auVar474._10_6_ = auVar475._10_6_;
  auVar474._0_8_ = auVar172._0_8_;
  auVar474._8_2_ = auVar65._0_2_;
  uVar16 = *(ulong *)(s + lVar24 + lVar136);
  uVar17 = *(undefined8 *)(s + lVar25 + lVar136);
  auVar430._8_6_ = 0;
  auVar430._0_8_ = uVar16;
  auVar430[0xe] = (char)(uVar16 >> 0x38);
  auVar430[0xf] = (char)((ulong)uVar17 >> 0x38);
  auVar429._14_2_ = auVar430._14_2_;
  auVar429._8_5_ = 0;
  auVar429._0_8_ = uVar16;
  uVar507 = (undefined1)((ulong)uVar17 >> 0x30);
  auVar429[0xd] = uVar507;
  uVar457 = (undefined1)(uVar16 >> 0x30);
  auVar428._13_3_ = auVar429._13_3_;
  auVar428._8_4_ = 0;
  auVar428._0_8_ = uVar16;
  auVar428[0xc] = uVar457;
  auVar427._12_4_ = auVar428._12_4_;
  auVar427._8_3_ = 0;
  auVar427._0_8_ = uVar16;
  uVar506 = (undefined1)((ulong)uVar17 >> 0x28);
  auVar427[0xb] = uVar506;
  uVar455 = (undefined1)(uVar16 >> 0x28);
  auVar426._11_5_ = auVar427._11_5_;
  auVar426._8_2_ = 0;
  auVar426._0_8_ = uVar16;
  auVar426[10] = uVar455;
  auVar425._10_6_ = auVar426._10_6_;
  auVar425[8] = 0;
  auVar425._0_8_ = uVar16;
  uVar505 = (undefined1)((ulong)uVar17 >> 0x20);
  auVar425[9] = uVar505;
  uVar453 = (undefined1)(uVar16 >> 0x20);
  auVar424._9_7_ = auVar425._9_7_;
  auVar424[8] = uVar453;
  auVar424._0_8_ = uVar16;
  Var28 = CONCAT91(CONCAT81(auVar424._8_8_,(char)((ulong)uVar17 >> 0x18)),(char)(uVar16 >> 0x18));
  uVar504 = (undefined1)((ulong)uVar17 >> 0x10);
  auVar69._2_10_ = Var28;
  auVar69[1] = uVar504;
  uVar451 = (undefined1)(uVar16 >> 0x10);
  auVar69[0] = uVar451;
  auVar494._0_12_ = auVar332._0_12_;
  auVar494._12_2_ = (short)Var64;
  auVar494._14_2_ = (short)Var28;
  auVar493._12_4_ = auVar494._12_4_;
  auVar493._0_10_ = auVar332._0_10_;
  auVar493._10_2_ = auVar69._0_2_;
  auVar492._10_6_ = auVar493._10_6_;
  auVar492._0_8_ = auVar332._0_8_;
  auVar492._8_2_ = auVar68._0_2_;
  uVar458 = CONCAT44(CONCAT22(CONCAT11((char)uVar17,(char)uVar16),auVar332._0_2_),
                     CONCAT22(CONCAT11((char)uVar13,(char)uVar12),auVar172._0_2_));
  uVar139 = CONCAT22(auVar396._12_2_,auVar177._12_2_);
  uVar168 = CONCAT22(auVar428._12_2_,auVar337._12_2_);
  uVar167 = (undefined4)(((uint6)auVar300._12_2_ << 0x20) >> 0x10);
  auVar256._0_8_ =
       CONCAT44(CONCAT22(auVar424._8_2_,auVar333._8_2_),CONCAT22(auVar392._8_2_,auVar173._8_2_));
  uVar18 = *(ulong *)s;
  uVar19 = *(undefined8 *)(s + lVar137);
  auVar149._8_6_ = 0;
  auVar149._0_8_ = uVar18;
  auVar149[0xe] = (char)(uVar18 >> 0x38);
  auVar149[0xf] = (char)((ulong)uVar19 >> 0x38);
  auVar148._14_2_ = auVar149._14_2_;
  auVar148._8_5_ = 0;
  auVar148._0_8_ = uVar18;
  auVar148[0xd] = (char)((ulong)uVar19 >> 0x30);
  auVar147._13_3_ = auVar148._13_3_;
  auVar147._8_4_ = 0;
  auVar147._0_8_ = uVar18;
  auVar147[0xc] = (char)(uVar18 >> 0x30);
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._8_3_ = 0;
  auVar146._0_8_ = uVar18;
  uStack_67 = (undefined1)((ulong)uVar19 >> 0x28);
  auVar146[0xb] = uStack_67;
  local_68 = (undefined1)(uVar18 >> 0x28);
  auVar145._11_5_ = auVar146._11_5_;
  auVar145._8_2_ = 0;
  auVar145._0_8_ = uVar18;
  auVar145[10] = local_68;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144[8] = 0;
  auVar144._0_8_ = uVar18;
  auVar144[9] = (char)((ulong)uVar19 >> 0x20);
  auVar143._9_7_ = auVar144._9_7_;
  auVar143[8] = (char)(uVar18 >> 0x20);
  auVar143._0_8_ = uVar18;
  Var28 = CONCAT91(CONCAT81(auVar143._8_8_,(char)((ulong)uVar19 >> 0x18)),(char)(uVar18 >> 0x18));
  auVar70._2_10_ = Var28;
  auVar70[1] = (char)((ulong)uVar19 >> 0x10);
  auVar70[0] = (char)(uVar18 >> 0x10);
  uStack_a7 = (undefined1)((ulong)uVar19 >> 8);
  auVar142._4_12_ = auVar70;
  auVar142[3] = uStack_a7;
  local_a8 = (undefined1)(uVar18 >> 8);
  auVar142[2] = local_a8;
  auVar142._0_2_ = CONCAT11((char)uVar19,(char)uVar18);
  uVar18 = *(ulong *)(s + lVar137 * 2);
  uVar19 = *(undefined8 *)(s + lVar22);
  auVar278._8_6_ = 0;
  auVar278._0_8_ = uVar18;
  auVar278[0xe] = (char)(uVar18 >> 0x38);
  auVar278[0xf] = (char)((ulong)uVar19 >> 0x38);
  auVar277._14_2_ = auVar278._14_2_;
  auVar277._8_5_ = 0;
  auVar277._0_8_ = uVar18;
  auVar277[0xd] = (char)((ulong)uVar19 >> 0x30);
  auVar276._13_3_ = auVar277._13_3_;
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar18;
  auVar276[0xc] = (char)(uVar18 >> 0x30);
  uStack_65 = (undefined1)((ulong)uVar19 >> 0x28);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_3_ = 0;
  auVar275._0_8_ = uVar18;
  auVar275[0xb] = uStack_65;
  uStack_66 = (undefined1)(uVar18 >> 0x28);
  auVar274._11_5_ = auVar275._11_5_;
  auVar274._8_2_ = 0;
  auVar274._0_8_ = uVar18;
  auVar274[10] = uStack_66;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273[8] = 0;
  auVar273._0_8_ = uVar18;
  auVar273[9] = (char)((ulong)uVar19 >> 0x20);
  auVar272._9_7_ = auVar273._9_7_;
  auVar272[8] = (char)(uVar18 >> 0x20);
  auVar272._0_8_ = uVar18;
  Var64 = CONCAT91(CONCAT81(auVar272._8_8_,(char)((ulong)uVar19 >> 0x18)),(char)(uVar18 >> 0x18));
  auVar71._2_10_ = Var64;
  auVar71[1] = (char)((ulong)uVar19 >> 0x10);
  auVar71[0] = (char)(uVar18 >> 0x10);
  uStack_a5 = (undefined1)((ulong)uVar19 >> 8);
  uStack_a6 = (undefined1)(uVar18 >> 8);
  uVar20 = *(ulong *)(s + lVar137 * 4);
  uVar21 = *(undefined8 *)(s + lVar23);
  auVar244._8_6_ = 0;
  auVar244._0_8_ = uVar20;
  auVar244[0xe] = (char)(uVar20 >> 0x38);
  auVar244[0xf] = (char)((ulong)uVar21 >> 0x38);
  auVar243._14_2_ = auVar244._14_2_;
  auVar243._8_5_ = 0;
  auVar243._0_8_ = uVar20;
  auVar243[0xd] = (char)((ulong)uVar21 >> 0x30);
  auVar242._13_3_ = auVar243._13_3_;
  auVar242._8_4_ = 0;
  auVar242._0_8_ = uVar20;
  auVar242[0xc] = (char)(uVar20 >> 0x30);
  uStack_63 = (undefined1)((ulong)uVar21 >> 0x28);
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._8_3_ = 0;
  auVar241._0_8_ = uVar20;
  auVar241[0xb] = uStack_63;
  uStack_64 = (undefined1)(uVar20 >> 0x28);
  auVar240._11_5_ = auVar241._11_5_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar20;
  auVar240[10] = uStack_64;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239[8] = 0;
  auVar239._0_8_ = uVar20;
  auVar239[9] = (char)((ulong)uVar21 >> 0x20);
  auVar238._9_7_ = auVar239._9_7_;
  auVar238[8] = (char)(uVar20 >> 0x20);
  auVar238._0_8_ = uVar20;
  Var66 = CONCAT91(CONCAT81(auVar238._8_8_,(char)((ulong)uVar21 >> 0x18)),(char)(uVar20 >> 0x18));
  auVar72._2_10_ = Var66;
  auVar72[1] = (char)((ulong)uVar21 >> 0x10);
  auVar72[0] = (char)(uVar20 >> 0x10);
  uStack_a3 = (undefined1)((ulong)uVar21 >> 8);
  auVar237._4_12_ = auVar72;
  auVar237[3] = uStack_a3;
  uStack_a4 = (undefined1)(uVar20 >> 8);
  auVar237[2] = uStack_a4;
  auVar237._0_2_ = CONCAT11((char)uVar21,(char)uVar20);
  uVar20 = *(ulong *)(s + lVar24);
  uVar21 = *(undefined8 *)(s + lVar25);
  auVar309._8_6_ = 0;
  auVar309._0_8_ = uVar20;
  auVar309[0xe] = (char)(uVar20 >> 0x38);
  auVar309[0xf] = (char)((ulong)uVar21 >> 0x38);
  auVar308._14_2_ = auVar309._14_2_;
  auVar308._8_5_ = 0;
  auVar308._0_8_ = uVar20;
  auVar308[0xd] = (char)((ulong)uVar21 >> 0x30);
  auVar307._13_3_ = auVar308._13_3_;
  auVar307._8_4_ = 0;
  auVar307._0_8_ = uVar20;
  auVar307[0xc] = (char)(uVar20 >> 0x30);
  uStack_61 = (undefined1)((ulong)uVar21 >> 0x28);
  auVar306._12_4_ = auVar307._12_4_;
  auVar306._8_3_ = 0;
  auVar306._0_8_ = uVar20;
  auVar306[0xb] = uStack_61;
  uStack_62 = (undefined1)(uVar20 >> 0x28);
  auVar305._11_5_ = auVar306._11_5_;
  auVar305._8_2_ = 0;
  auVar305._0_8_ = uVar20;
  auVar305[10] = uStack_62;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304[8] = 0;
  auVar304._0_8_ = uVar20;
  auVar304[9] = (char)((ulong)uVar21 >> 0x20);
  auVar303._9_7_ = auVar304._9_7_;
  auVar303[8] = (char)(uVar20 >> 0x20);
  auVar303._0_8_ = uVar20;
  Var74 = CONCAT91(CONCAT81(auVar303._8_8_,(char)((ulong)uVar21 >> 0x18)),(char)(uVar20 >> 0x18));
  auVar73._2_10_ = Var74;
  auVar73[1] = (char)((ulong)uVar21 >> 0x10);
  auVar73[0] = (char)(uVar20 >> 0x10);
  uStack_a1 = (undefined1)((ulong)uVar21 >> 8);
  uStack_a2 = (undefined1)(uVar20 >> 8);
  auVar383._0_12_ = auVar142._0_12_;
  auVar383._12_2_ = (short)Var28;
  auVar383._14_2_ = (short)Var64;
  auVar382._12_4_ = auVar383._12_4_;
  auVar382._0_10_ = auVar142._0_10_;
  auVar382._10_2_ = auVar71._0_2_;
  auVar381._10_6_ = auVar382._10_6_;
  auVar381._0_8_ = auVar142._0_8_;
  auVar381._8_2_ = auVar70._0_2_;
  local_b8 = CONCAT22(CONCAT11((char)uVar19,(char)uVar18),auVar142._0_2_);
  uVar18 = *(ulong *)(s + lVar137 * 8);
  uVar19 = *(undefined8 *)(s + lVar137 * 9);
  auVar187._8_6_ = 0;
  auVar187._0_8_ = uVar18;
  auVar187[0xe] = (char)(uVar18 >> 0x38);
  auVar187[0xf] = (char)((ulong)uVar19 >> 0x38);
  auVar186._14_2_ = auVar187._14_2_;
  auVar186._8_5_ = 0;
  auVar186._0_8_ = uVar18;
  auVar186[0xd] = (char)((ulong)uVar19 >> 0x30);
  auVar185._13_3_ = auVar186._13_3_;
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar18;
  auVar185[0xc] = (char)(uVar18 >> 0x30);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_3_ = 0;
  auVar184._0_8_ = uVar18;
  auVar184[0xb] = (char)((ulong)uVar19 >> 0x28);
  auVar183._11_5_ = auVar184._11_5_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar18;
  auVar183[10] = (char)(uVar18 >> 0x28);
  auVar182._10_6_ = auVar183._10_6_;
  auVar182[8] = 0;
  auVar182._0_8_ = uVar18;
  auVar182[9] = (char)((ulong)uVar19 >> 0x20);
  auVar181._9_7_ = auVar182._9_7_;
  auVar181[8] = (char)(uVar18 >> 0x20);
  auVar181._0_8_ = uVar18;
  Var28 = CONCAT91(CONCAT81(auVar181._8_8_,(char)((ulong)uVar19 >> 0x18)),(char)(uVar18 >> 0x18));
  auVar76._2_10_ = Var28;
  auVar76[1] = (char)((ulong)uVar19 >> 0x10);
  auVar76[0] = (char)(uVar18 >> 0x10);
  auVar75._2_12_ = auVar76;
  auVar75[1] = (char)((ulong)uVar19 >> 8);
  auVar75[0] = (char)(uVar18 >> 8);
  auVar180._0_2_ = CONCAT11((char)uVar19,(char)uVar18);
  auVar180._2_14_ = auVar75;
  auVar464._0_12_ = auVar237._0_12_;
  auVar464._12_2_ = (short)Var66;
  auVar464._14_2_ = (short)Var74;
  auVar463._12_4_ = auVar464._12_4_;
  auVar463._0_10_ = auVar237._0_10_;
  auVar463._10_2_ = auVar73._0_2_;
  auVar462._10_6_ = auVar463._10_6_;
  auVar462._0_8_ = auVar237._0_8_;
  auVar462._8_2_ = auVar72._0_2_;
  uStack_b4 = CONCAT22(CONCAT11((char)uVar21,(char)uVar20),auVar237._0_2_);
  uVar18 = *(ulong *)(s + lVar137 * 10);
  uVar19 = *(undefined8 *)(s + lVar137 * 0xb);
  auVar405._8_6_ = 0;
  auVar405._0_8_ = uVar18;
  auVar405[0xe] = (char)(uVar18 >> 0x38);
  auVar405[0xf] = (char)((ulong)uVar19 >> 0x38);
  auVar404._14_2_ = auVar405._14_2_;
  auVar404._8_5_ = 0;
  auVar404._0_8_ = uVar18;
  auVar404[0xd] = (char)((ulong)uVar19 >> 0x30);
  auVar403._13_3_ = auVar404._13_3_;
  auVar403._8_4_ = 0;
  auVar403._0_8_ = uVar18;
  auVar403[0xc] = (char)(uVar18 >> 0x30);
  auVar402._12_4_ = auVar403._12_4_;
  auVar402._8_3_ = 0;
  auVar402._0_8_ = uVar18;
  auVar402[0xb] = (char)((ulong)uVar19 >> 0x28);
  auVar401._11_5_ = auVar402._11_5_;
  auVar401._8_2_ = 0;
  auVar401._0_8_ = uVar18;
  auVar401[10] = (char)(uVar18 >> 0x28);
  auVar400._10_6_ = auVar401._10_6_;
  auVar400[8] = 0;
  auVar400._0_8_ = uVar18;
  auVar400[9] = (char)((ulong)uVar19 >> 0x20);
  auVar399._9_7_ = auVar400._9_7_;
  auVar399[8] = (char)(uVar18 >> 0x20);
  auVar399._0_8_ = uVar18;
  Var64 = CONCAT91(CONCAT81(auVar399._8_8_,(char)((ulong)uVar19 >> 0x18)),(char)(uVar18 >> 0x18));
  auVar78._2_10_ = Var64;
  auVar78[1] = (char)((ulong)uVar19 >> 0x10);
  auVar78[0] = (char)(uVar18 >> 0x10);
  auVar77._2_12_ = auVar78;
  auVar77[1] = (char)((ulong)uVar19 >> 8);
  auVar77[0] = (char)(uVar18 >> 8);
  uVar20 = *(ulong *)(s + lVar137 * 0xc);
  uVar21 = *(undefined8 *)(s + lVar137 * 0xd);
  auVar347._8_6_ = 0;
  auVar347._0_8_ = uVar20;
  auVar347[0xe] = (char)(uVar20 >> 0x38);
  auVar347[0xf] = (char)((ulong)uVar21 >> 0x38);
  auVar346._14_2_ = auVar347._14_2_;
  auVar346._8_5_ = 0;
  auVar346._0_8_ = uVar20;
  auVar346[0xd] = (char)((ulong)uVar21 >> 0x30);
  auVar345._13_3_ = auVar346._13_3_;
  auVar345._8_4_ = 0;
  auVar345._0_8_ = uVar20;
  auVar345[0xc] = (char)(uVar20 >> 0x30);
  auVar344._12_4_ = auVar345._12_4_;
  auVar344._8_3_ = 0;
  auVar344._0_8_ = uVar20;
  auVar344[0xb] = (char)((ulong)uVar21 >> 0x28);
  auVar343._11_5_ = auVar344._11_5_;
  auVar343._8_2_ = 0;
  auVar343._0_8_ = uVar20;
  auVar343[10] = (char)(uVar20 >> 0x28);
  auVar342._10_6_ = auVar343._10_6_;
  auVar342[8] = 0;
  auVar342._0_8_ = uVar20;
  auVar342[9] = (char)((ulong)uVar21 >> 0x20);
  auVar341._9_7_ = auVar342._9_7_;
  auVar341[8] = (char)(uVar20 >> 0x20);
  auVar341._0_8_ = uVar20;
  Var66 = CONCAT91(CONCAT81(auVar341._8_8_,(char)((ulong)uVar21 >> 0x18)),(char)(uVar20 >> 0x18));
  auVar80._2_10_ = Var66;
  auVar80[1] = (char)((ulong)uVar21 >> 0x10);
  auVar80[0] = (char)(uVar20 >> 0x10);
  auVar79._2_12_ = auVar80;
  auVar79[1] = (char)((ulong)uVar21 >> 8);
  auVar79[0] = (char)(uVar20 >> 8);
  auVar340._0_2_ = CONCAT11((char)uVar21,(char)uVar20);
  auVar340._2_14_ = auVar79;
  auVar480._0_12_ = auVar180._0_12_;
  auVar480._12_2_ = (short)Var28;
  auVar480._14_2_ = (short)Var64;
  auVar479._12_4_ = auVar480._12_4_;
  auVar479._0_10_ = auVar180._0_10_;
  auVar479._10_2_ = auVar78._0_2_;
  auVar478._10_6_ = auVar479._10_6_;
  auVar478._0_8_ = auVar180._0_8_;
  auVar478._8_2_ = auVar76._0_2_;
  auVar81._4_8_ = auVar478._8_8_;
  auVar81._2_2_ = auVar77._0_2_;
  auVar81._0_2_ = auVar75._0_2_;
  auVar477._0_4_ = CONCAT22(CONCAT11((char)uVar19,(char)uVar18),auVar180._0_2_);
  auVar477._4_12_ = auVar81;
  uVar18 = *(ulong *)(s + lVar137 * 0xe);
  uVar19 = *(undefined8 *)(s + lVar137 * 0xf);
  auVar437._8_6_ = 0;
  auVar437._0_8_ = uVar18;
  auVar437[0xe] = (char)(uVar18 >> 0x38);
  auVar437[0xf] = (char)((ulong)uVar19 >> 0x38);
  auVar436._14_2_ = auVar437._14_2_;
  auVar436._8_5_ = 0;
  auVar436._0_8_ = uVar18;
  auVar436[0xd] = (char)((ulong)uVar19 >> 0x30);
  auVar435._13_3_ = auVar436._13_3_;
  auVar435._8_4_ = 0;
  auVar435._0_8_ = uVar18;
  auVar435[0xc] = (char)(uVar18 >> 0x30);
  auVar434._12_4_ = auVar435._12_4_;
  auVar434._8_3_ = 0;
  auVar434._0_8_ = uVar18;
  auVar434[0xb] = (char)((ulong)uVar19 >> 0x28);
  auVar433._11_5_ = auVar434._11_5_;
  auVar433._8_2_ = 0;
  auVar433._0_8_ = uVar18;
  auVar433[10] = (char)(uVar18 >> 0x28);
  auVar432._10_6_ = auVar433._10_6_;
  auVar432[8] = 0;
  auVar432._0_8_ = uVar18;
  auVar432[9] = (char)((ulong)uVar19 >> 0x20);
  auVar431._9_7_ = auVar432._9_7_;
  auVar431[8] = (char)(uVar18 >> 0x20);
  auVar431._0_8_ = uVar18;
  Var28 = CONCAT91(CONCAT81(auVar431._8_8_,(char)((ulong)uVar19 >> 0x18)),(char)(uVar18 >> 0x18));
  auVar83._2_10_ = Var28;
  auVar83[1] = (char)((ulong)uVar19 >> 0x10);
  auVar83[0] = (char)(uVar18 >> 0x10);
  auVar82._2_12_ = auVar83;
  auVar82[1] = (char)((ulong)uVar19 >> 8);
  auVar82[0] = (char)(uVar18 >> 8);
  auVar497._0_12_ = auVar340._0_12_;
  auVar497._12_2_ = (short)Var66;
  auVar497._14_2_ = (short)Var28;
  auVar496._12_4_ = auVar497._12_4_;
  auVar496._0_10_ = auVar340._0_10_;
  auVar496._10_2_ = auVar83._0_2_;
  auVar495._10_6_ = auVar496._10_6_;
  auVar495._0_8_ = auVar340._0_8_;
  auVar495._8_2_ = auVar80._0_2_;
  auVar84._4_8_ = auVar495._8_8_;
  auVar84._2_2_ = auVar82._0_2_;
  auVar84._0_2_ = auVar79._0_2_;
  local_98 = auVar381._8_4_;
  uStack_94 = auVar462._8_4_;
  auVar465._0_8_ = auVar477._0_8_;
  auVar465._8_4_ = auVar81._0_4_;
  auVar465._12_4_ = auVar84._0_4_;
  uStack_a0 = auVar465._8_8_;
  uStack_b0 = CONCAT44(CONCAT22(CONCAT11((char)uVar19,(char)uVar18),auVar340._0_2_),auVar477._0_4_);
  uStack_90 = auVar478._8_4_;
  uStack_8c = auVar495._8_4_;
  local_78 = CONCAT22(auVar272._8_2_,auVar143._8_2_);
  local_58 = CONCAT22(auVar276._12_2_,auVar147._12_2_);
  uVar135 = CONCAT24(auVar148._14_2_,local_58);
  uVar19 = CONCAT26(auVar277._14_2_,uVar135);
  uStack_74 = CONCAT22(auVar303._8_2_,auVar238._8_2_);
  uStack_54 = CONCAT22(auVar307._12_2_,auVar242._12_2_);
  uVar135 = CONCAT24(auVar243._14_2_,uStack_54);
  uVar21 = CONCAT26(auVar308._14_2_,uVar135);
  uVar138 = CONCAT22(auVar399._8_2_,auVar181._8_2_);
  auVar169._0_8_ = CONCAT26(auVar401._10_2_,CONCAT24(auVar183._10_2_,uVar138));
  auVar169._8_2_ = auVar185._12_2_;
  auVar169._10_2_ = auVar403._12_2_;
  auVar188._12_2_ = auVar186._14_2_;
  auVar188._0_12_ = auVar169;
  auVar188._14_2_ = auVar404._14_2_;
  uVar226 = CONCAT22(auVar431._8_2_,auVar341._8_2_);
  auVar329._0_8_ = CONCAT26(auVar433._10_2_,CONCAT24(auVar343._10_2_,uVar226));
  auVar329._8_2_ = auVar345._12_2_;
  auVar329._10_2_ = auVar435._12_2_;
  auVar348._12_2_ = auVar346._14_2_;
  auVar348._0_12_ = auVar329;
  auVar348._14_2_ = auVar436._14_2_;
  uStack_40 = (undefined4)((ulong)uVar19 >> 0x20);
  uStack_3c = (undefined4)((ulong)uVar21 >> 0x20);
  auVar245._8_4_ = (int)((ulong)auVar169._0_8_ >> 0x20);
  auVar245._0_8_ = auVar169._0_8_;
  auVar245._12_4_ = (int)((ulong)auVar329._0_8_ >> 0x20);
  uStack_60 = auVar245._8_8_;
  uStack_70 = CONCAT44(uVar226,uVar138);
  uStack_50 = auVar169._8_4_;
  uStack_4c = auVar329._8_4_;
  uStack_38 = auVar188._12_4_;
  uStack_34 = auVar348._12_4_;
  uStack_80 = auVar382._12_4_;
  uStack_7c = auVar463._12_4_;
  (*aom_lpf_horizontal_14_quad)((uint8_t *)&local_b8,0x10,_blimit0,_limit0,_thresh0);
  auVar26._2_8_ = uVar458;
  auVar26._0_2_ = uVar295;
  auVar26._10_6_ = 0;
  auVar26 = auVar26 << 0x30;
  uVar18 = CONCAT44(auVar474._8_4_,auVar459._8_4_);
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar18;
  auVar32 = auVar32 << 0x20;
  auVar129._8_4_ = auVar492._8_4_;
  auVar129._0_8_ = uVar18;
  auVar129._12_4_ = 0;
  auVar36._2_8_ = auVar256._0_8_;
  auVar36._0_2_ = auVar296._8_2_;
  auVar36._10_6_ = 0;
  auVar36 = auVar36 << 0x30;
  uVar20 = CONCAT44(uVar139,uVar167);
  auVar40._8_4_ = 0;
  auVar40._0_8_ = uVar20;
  auVar40 = auVar40 << 0x20;
  auVar130._8_4_ = uVar168;
  auVar130._0_8_ = uVar20;
  auVar130._12_4_ = 0;
  auVar156._0_14_ = auVar26._0_14_;
  auVar156[0xe] = (char)uVar9;
  auVar156[0xf] = (char)((ulong)uVar9 >> 8);
  auVar155._14_2_ = auVar156._14_2_;
  auVar155._0_13_ = auVar26._0_13_;
  auVar155[0xd] = (char)(uVar8 >> 8);
  auVar154._13_3_ = auVar155._13_3_;
  auVar154._0_12_ = auVar26._0_12_;
  auVar154[0xc] = (char)uVar8;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_11_ = auVar26._0_11_;
  auVar153[0xb] = uVar209;
  auVar152._11_5_ = auVar153._11_5_;
  auVar152._0_10_ = auVar26._0_10_;
  auVar152[10] = (char)uVar7;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_9_ = auVar26._0_9_;
  auVar151[9] = uVar265;
  Var131 = CONCAT73(auVar151._9_7_,CONCAT12((char)uVar6,uVar295));
  Var28 = CONCAT91(CONCAT81((long)((unkuint10)Var131 >> 0x10),uVar208),(char)uVar5);
  auVar86._2_10_ = Var28;
  auVar86[1] = uVar293;
  auVar86[0] = (char)uVar4;
  auVar85._2_12_ = auVar86;
  auVar85[1] = uVar207;
  auVar85[0] = (char)uVar3;
  auVar150._0_2_ = (undefined2)uVar2;
  auVar150._2_14_ = auVar85;
  auVar283._0_14_ = SUB1614(auVar129 << 0x20,0);
  auVar283[0xe] = uVar211;
  auVar283[0xf] = uStack_101;
  auVar282._14_2_ = auVar283._14_2_;
  auVar282._0_13_ = SUB1613(auVar129 << 0x20,0);
  auVar282[0xd] = uStack_102;
  auVar132[8] = uVar322;
  auVar132._0_8_ = uVar18;
  auVar132._9_3_ = auVar282._13_3_;
  auVar281._12_4_ = auVar132._8_4_;
  auVar281._0_11_ = auVar32._0_11_;
  auVar281[0xb] = uStack_103;
  auVar280._11_5_ = auVar281._11_5_;
  auVar280._0_10_ = auVar32._0_10_;
  auVar280[10] = uVar210;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._0_9_ = auVar32._0_9_;
  auVar279[9] = uStack_104;
  auVar127[4] = uVar266;
  auVar127._0_4_ = auVar459._8_4_;
  auVar127._5_7_ = auVar279._9_7_;
  Var64 = CONCAT91(CONCAT81(auVar127._4_8_,uStack_105),(char)((ulong)uVar5 >> 0x10));
  auVar88._2_10_ = Var64;
  auVar88[1] = uStack_106;
  auVar88[0] = (char)((ulong)uVar4 >> 0x10);
  auVar87._2_12_ = auVar88;
  auVar87[1] = uStack_107;
  auVar87[0] = (char)((ulong)uVar3 >> 0x10);
  auVar252._0_14_ = auVar36._0_14_;
  auVar252[0xe] = uVar216;
  auVar252[0xf] = uVar220;
  auVar251._14_2_ = auVar252._14_2_;
  auVar251._0_13_ = auVar36._0_13_;
  auVar251[0xd] = uVar325;
  auVar250._13_3_ = auVar251._13_3_;
  auVar250._0_12_ = auVar36._0_12_;
  auVar250[0xc] = uVar324;
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._0_11_ = auVar36._0_11_;
  auVar249[0xb] = uVar219;
  auVar248._11_5_ = auVar249._11_5_;
  auVar248._0_10_ = auVar36._0_10_;
  auVar248[10] = uVar215;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._0_9_ = auVar36._0_9_;
  auVar247[9] = uVar269;
  Var133 = CONCAT73(auVar247._9_7_,CONCAT12(uVar268,auVar296._8_2_));
  Var66 = CONCAT91(CONCAT81((long)((unkuint10)Var133 >> 0x10),uVar218),(char)((ulong)uVar5 >> 0x20))
  ;
  auVar90._2_10_ = Var66;
  auVar90[1] = uVar294;
  auVar90[0] = (char)((ulong)uVar4 >> 0x20);
  auVar89._2_12_ = auVar90;
  auVar89[1] = uVar217;
  auVar89[0] = (char)((ulong)uVar3 >> 0x20);
  auVar246._0_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  auVar246._2_14_ = auVar89;
  auVar314._0_14_ = SUB1614(auVar130 << 0x20,0);
  auVar314[0xe] = uVar222;
  auVar314[0xf] = uStack_c1;
  auVar313._14_2_ = auVar314._14_2_;
  auVar313._0_13_ = SUB1613(auVar130 << 0x20,0);
  auVar313[0xd] = uStack_c2;
  auVar134[8] = uVar326;
  auVar134._0_8_ = uVar20;
  auVar134._9_3_ = auVar313._13_3_;
  auVar312._12_4_ = auVar134._8_4_;
  auVar312._0_11_ = auVar40._0_11_;
  auVar312[0xb] = uStack_c3;
  auVar311._11_5_ = auVar312._11_5_;
  auVar311._0_10_ = auVar40._0_10_;
  auVar311[10] = uVar221;
  auVar310._10_6_ = auVar311._10_6_;
  auVar310._0_9_ = auVar40._0_9_;
  auVar310[9] = uStack_c4;
  auVar128[4] = uVar270;
  auVar128._0_4_ = uVar167;
  auVar128._5_7_ = auVar310._9_7_;
  Var74 = CONCAT91(CONCAT81(auVar128._4_8_,uStack_c5),(char)((ulong)uVar5 >> 0x30));
  auVar92._2_10_ = Var74;
  auVar92[1] = uStack_c6;
  auVar92[0] = (char)((ulong)uVar4 >> 0x30);
  auVar91._2_12_ = auVar92;
  auVar91[1] = uStack_c7;
  auVar91[0] = (char)((ulong)uVar3 >> 0x30);
  auVar44._8_8_ = uStack_b0;
  auVar44._0_8_ = CONCAT44(uStack_b4,local_b8);
  auVar196._0_14_ = auVar44._0_14_;
  auVar196[0xe] = (char)((uint)uStack_b4 >> 0x18);
  auVar196[0xf] = uStack_a1;
  auVar195._14_2_ = auVar196._14_2_;
  auVar195._0_13_ = auVar44._0_13_;
  auVar195[0xd] = uStack_a2;
  auVar194._13_3_ = auVar195._13_3_;
  auVar194._0_12_ = auVar44._0_12_;
  auVar194[0xc] = (char)((uint)uStack_b4 >> 0x10);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._0_11_ = auVar44._0_11_;
  auVar193[0xb] = uStack_a3;
  auVar192._11_5_ = auVar193._11_5_;
  auVar192._0_10_ = auVar44._0_10_;
  auVar192[10] = (char)((uint)uStack_b4 >> 8);
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._0_9_ = auVar44._0_9_;
  auVar191[9] = uStack_a4;
  auVar190._9_7_ = auVar191._9_7_;
  auVar190[8] = (char)uStack_b4;
  auVar190._0_8_ = CONCAT44(uStack_b4,local_b8);
  Var95 = CONCAT91(CONCAT81(auVar190._8_8_,uStack_a5),(char)((uint)local_b8 >> 0x18));
  auVar94._2_10_ = Var95;
  auVar94[1] = uStack_a6;
  auVar94[0] = (char)((uint)local_b8 >> 0x10);
  auVar93._2_12_ = auVar94;
  auVar93[1] = uStack_a7;
  auVar93[0] = (char)((uint)local_b8 >> 8);
  auVar189._0_2_ = CONCAT11(local_a8,(char)local_b8);
  auVar189._2_14_ = auVar93;
  auVar387._0_12_ = auVar150._0_12_;
  auVar387._12_2_ = (short)Var28;
  auVar387._14_2_ = (short)Var64;
  auVar386._12_4_ = auVar387._12_4_;
  auVar386._0_10_ = auVar150._0_10_;
  auVar386._10_2_ = auVar88._0_2_;
  auVar385._10_6_ = auVar386._10_6_;
  auVar385._0_8_ = auVar150._0_8_;
  auVar385._8_2_ = auVar86._0_2_;
  auVar96._4_8_ = auVar385._8_8_;
  auVar96._2_2_ = auVar87._0_2_;
  auVar96._0_2_ = auVar85._0_2_;
  auVar384._0_4_ = CONCAT22(CONCAT11(local_108,(char)((ulong)uVar2 >> 0x10)),auVar150._0_2_);
  auVar384._4_12_ = auVar96;
  auVar49._8_4_ = uStack_90;
  auVar49._0_8_ = CONCAT44(uStack_94,local_98);
  auVar48._12_4_ = uStack_8c;
  auVar48._0_12_ = auVar49;
  auVar412._0_14_ = auVar48._0_14_;
  auVar412[0xe] = (char)((uint)uStack_94 >> 0x18);
  auVar412[0xf] = uStack_81;
  auVar411._14_2_ = auVar412._14_2_;
  auVar411._0_13_ = auVar48._0_13_;
  auVar411[0xd] = uStack_82;
  auVar410._13_3_ = auVar411._13_3_;
  auVar410[0xc] = (char)((uint)uStack_94 >> 0x10);
  auVar410._0_12_ = auVar49;
  auVar409._12_4_ = auVar410._12_4_;
  auVar409._0_11_ = auVar49._0_11_;
  auVar409[0xb] = uStack_83;
  auVar408._11_5_ = auVar409._11_5_;
  auVar408._0_10_ = auVar49._0_10_;
  auVar408[10] = (char)((uint)uStack_94 >> 8);
  auVar407._10_6_ = auVar408._10_6_;
  auVar407._0_9_ = auVar49._0_9_;
  auVar407[9] = uStack_84;
  auVar406._9_7_ = auVar407._9_7_;
  auVar406[8] = (char)uStack_94;
  auVar406._0_8_ = CONCAT44(uStack_94,local_98);
  Var28 = CONCAT91(CONCAT81(auVar406._8_8_,uStack_85),(char)((uint)local_98 >> 0x18));
  auVar98._2_10_ = Var28;
  auVar98[1] = uStack_86;
  auVar98[0] = (char)((uint)local_98 >> 0x10);
  auVar97._2_12_ = auVar98;
  auVar97[1] = uStack_87;
  auVar97[0] = (char)((uint)local_98 >> 8);
  auVar53._8_8_ = uStack_70;
  auVar53._0_8_ = CONCAT44(uStack_74,local_78);
  auVar356._0_14_ = auVar53._0_14_;
  auVar356[0xe] = (char)((uint)uStack_74 >> 0x18);
  auVar356[0xf] = uStack_61;
  auVar355._14_2_ = auVar356._14_2_;
  auVar355._0_13_ = auVar53._0_13_;
  auVar355[0xd] = uStack_62;
  auVar354._13_3_ = auVar355._13_3_;
  auVar354._0_12_ = auVar53._0_12_;
  auVar354[0xc] = (char)((uint)uStack_74 >> 0x10);
  auVar353._12_4_ = auVar354._12_4_;
  auVar353._0_11_ = auVar53._0_11_;
  auVar353[0xb] = uStack_63;
  auVar352._11_5_ = auVar353._11_5_;
  auVar352._0_10_ = auVar53._0_10_;
  auVar352[10] = (char)((uint)uStack_74 >> 8);
  auVar351._10_6_ = auVar352._10_6_;
  auVar351._0_9_ = auVar53._0_9_;
  auVar351[9] = uStack_64;
  auVar350._9_7_ = auVar351._9_7_;
  auVar350[8] = (char)uStack_74;
  auVar350._0_8_ = CONCAT44(uStack_74,local_78);
  Var64 = CONCAT91(CONCAT81(auVar350._8_8_,uStack_65),(char)((uint)local_78 >> 0x18));
  auVar100._2_10_ = Var64;
  auVar100[1] = uStack_66;
  auVar100[0] = (char)((uint)local_78 >> 0x10);
  auVar99._2_12_ = auVar100;
  auVar99[1] = uStack_67;
  auVar99[0] = (char)((uint)local_78 >> 8);
  auVar349._0_2_ = CONCAT11(local_68,(char)local_78);
  auVar349._2_14_ = auVar99;
  auVar440._0_12_ = auVar246._0_12_;
  auVar440._12_2_ = (short)Var66;
  auVar440._14_2_ = (short)Var74;
  auVar439._12_4_ = auVar440._12_4_;
  auVar439._0_10_ = auVar246._0_10_;
  auVar439._10_2_ = auVar92._0_2_;
  auVar438._10_6_ = auVar439._10_6_;
  auVar438._0_8_ = auVar246._0_8_;
  auVar438._8_2_ = auVar90._0_2_;
  auVar101._4_8_ = auVar438._8_8_;
  auVar101._2_2_ = auVar91._0_2_;
  auVar101._0_2_ = auVar89._0_2_;
  auVar469._0_12_ = auVar189._0_12_;
  auVar469._12_2_ = (short)Var95;
  auVar469._14_2_ = (short)Var28;
  auVar468._12_4_ = auVar469._12_4_;
  auVar468._0_10_ = auVar189._0_10_;
  auVar468._10_2_ = auVar98._0_2_;
  auVar467._10_6_ = auVar468._10_6_;
  auVar467._0_8_ = auVar189._0_8_;
  auVar467._8_2_ = auVar94._0_2_;
  auVar102._4_8_ = auVar467._8_8_;
  auVar102._2_2_ = auVar97._0_2_;
  auVar102._0_2_ = auVar93._0_2_;
  auVar466._0_4_ = CONCAT22(CONCAT11(local_88,(char)local_98),auVar189._0_2_);
  auVar466._4_12_ = auVar102;
  auVar58._8_4_ = uStack_50;
  auVar58._0_8_ = CONCAT44(uStack_54,local_58);
  auVar57._12_4_ = uStack_4c;
  auVar57._0_12_ = auVar58;
  auVar487._0_14_ = auVar57._0_14_;
  auVar487[0xe] = (char)((uint)uStack_54 >> 0x18);
  auVar487[0xf] = uStack_41;
  auVar486._14_2_ = auVar487._14_2_;
  auVar486._0_13_ = auVar57._0_13_;
  auVar486[0xd] = uStack_42;
  auVar485._13_3_ = auVar486._13_3_;
  auVar485[0xc] = (char)((uint)uStack_54 >> 0x10);
  auVar485._0_12_ = auVar58;
  auVar484._12_4_ = auVar485._12_4_;
  auVar484._0_11_ = auVar58._0_11_;
  auVar484[0xb] = uStack_43;
  auVar483._11_5_ = auVar484._11_5_;
  auVar483._0_10_ = auVar58._0_10_;
  auVar483[10] = (char)((uint)uStack_54 >> 8);
  auVar482._10_6_ = auVar483._10_6_;
  auVar482._0_9_ = auVar58._0_9_;
  auVar482[9] = uStack_44;
  auVar481._9_7_ = auVar482._9_7_;
  auVar481[8] = (char)uStack_54;
  auVar481._0_8_ = CONCAT44(uStack_54,local_58);
  Var28 = CONCAT91(CONCAT81(auVar481._8_8_,uStack_45),(char)((uint)local_58 >> 0x18));
  auVar104._2_10_ = Var28;
  auVar104[1] = uStack_46;
  auVar104[0] = (char)((uint)local_58 >> 0x10);
  auVar103._2_12_ = auVar104;
  auVar103[1] = uStack_47;
  auVar103[0] = (char)((uint)local_58 >> 8);
  auVar500._0_12_ = auVar349._0_12_;
  auVar500._12_2_ = (short)Var64;
  auVar500._14_2_ = (short)Var28;
  auVar499._12_4_ = auVar500._12_4_;
  auVar499._0_10_ = auVar349._0_10_;
  auVar499._10_2_ = auVar104._0_2_;
  auVar498._10_6_ = auVar499._10_6_;
  auVar498._0_8_ = auVar349._0_8_;
  auVar498._8_2_ = auVar100._0_2_;
  auVar105._4_8_ = auVar498._8_8_;
  auVar105._2_2_ = auVar103._0_2_;
  auVar105._0_2_ = auVar99._0_2_;
  auVar508._0_8_ = auVar384._0_8_;
  auVar508._8_4_ = auVar96._0_4_;
  auVar508._12_4_ = auVar101._0_4_;
  auVar441._0_8_ = auVar466._0_8_;
  auVar441._8_4_ = auVar102._0_4_;
  auVar441._12_4_ = auVar105._0_4_;
  *(ulong *)(s + -8) =
       CONCAT44(CONCAT22(CONCAT11(local_c8,(char)((ulong)uVar2 >> 0x30)),auVar246._0_2_),
                auVar384._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(CONCAT11(local_48,(char)local_58),auVar349._0_2_),auVar466._0_4_);
  *(long *)(s + lVar137 + -8) = auVar508._8_8_;
  *(long *)(s + lVar137 + -8 + 8) = auVar441._8_8_;
  puVar1 = s + lVar137 * 2 + -8;
  *(int *)puVar1 = auVar385._8_4_;
  *(int *)(puVar1 + 4) = auVar438._8_4_;
  *(int *)(puVar1 + 8) = auVar467._8_4_;
  *(int *)(puVar1 + 0xc) = auVar498._8_4_;
  *(undefined4 *)(s + lVar22) = auVar386._12_4_;
  *(undefined4 *)(s + lVar22 + 4) = auVar439._12_4_;
  *(undefined4 *)(s + lVar22 + 8) = auVar468._12_4_;
  *(undefined4 *)(s + lVar22 + 0xc) = auVar499._12_4_;
  uVar138 = CONCAT22(auVar127._4_2_,(short)((unkuint10)Var131 >> 0x10));
  auVar140._0_8_ = CONCAT26(auVar280._10_2_,CONCAT24(auVar152._10_2_,uVar138));
  auVar140._8_2_ = auVar154._12_2_;
  auVar140._10_2_ = auVar132._8_2_;
  auVar157._12_2_ = auVar155._14_2_;
  auVar157._0_12_ = auVar140;
  auVar157._14_2_ = auVar282._14_2_;
  uVar226 = CONCAT22(auVar128._4_2_,(short)((unkuint10)Var133 >> 0x10));
  auVar227._0_8_ = CONCAT26(auVar311._10_2_,CONCAT24(auVar248._10_2_,uVar226));
  auVar227._8_2_ = auVar250._12_2_;
  auVar227._10_2_ = auVar134._8_2_;
  auVar253._12_2_ = auVar251._14_2_;
  auVar253._0_12_ = auVar227;
  auVar253._14_2_ = auVar313._14_2_;
  uVar167 = CONCAT22(auVar406._8_2_,auVar190._8_2_);
  auVar170._0_8_ = CONCAT26(auVar408._10_2_,CONCAT24(auVar192._10_2_,uVar167));
  auVar170._8_2_ = auVar194._12_2_;
  auVar170._10_2_ = auVar410._12_2_;
  auVar197._12_2_ = auVar195._14_2_;
  auVar197._0_12_ = auVar170;
  auVar197._14_2_ = auVar411._14_2_;
  uVar328 = CONCAT22(auVar481._8_2_,auVar350._8_2_);
  auVar330._0_8_ = CONCAT26(auVar483._10_2_,CONCAT24(auVar352._10_2_,uVar328));
  auVar330._8_2_ = auVar354._12_2_;
  auVar330._10_2_ = auVar485._12_2_;
  auVar357._12_2_ = auVar355._14_2_;
  auVar357._0_12_ = auVar330;
  auVar357._14_2_ = auVar486._14_2_;
  auVar284._8_4_ = (int)((ulong)auVar140._0_8_ >> 0x20);
  auVar284._0_8_ = auVar140._0_8_;
  auVar284._12_4_ = (int)((ulong)auVar227._0_8_ >> 0x20);
  auVar254._8_4_ = (int)((ulong)auVar170._0_8_ >> 0x20);
  auVar254._0_8_ = auVar170._0_8_;
  auVar254._12_4_ = (int)((ulong)auVar330._0_8_ >> 0x20);
  *(ulong *)(s + lVar137 * 4 + -8) = CONCAT44(uVar226,uVar138);
  *(ulong *)(s + lVar137 * 4 + -8 + 8) = CONCAT44(uVar328,uVar167);
  *(long *)(s + lVar23 + -8) = auVar284._8_8_;
  *(long *)(s + lVar23 + -8 + 8) = auVar254._8_8_;
  puVar1 = s + lVar24 + -8;
  *(int *)puVar1 = auVar140._8_4_;
  *(int *)(puVar1 + 4) = auVar227._8_4_;
  *(int *)(puVar1 + 8) = auVar170._8_4_;
  *(int *)(puVar1 + 0xc) = auVar330._8_4_;
  *(int *)(s + lVar25) = auVar157._12_4_;
  *(int *)(s + lVar25 + 4) = auVar253._12_4_;
  *(int *)(s + lVar25 + 8) = auVar197._12_4_;
  *(int *)(s + lVar25 + 0xc) = auVar357._12_4_;
  Var27 = CONCAT18((char)((ulong)uVar2 >> 8),uVar458);
  Var28 = CONCAT19(uVar207,Var27);
  auVar29[10] = uVar293;
  auVar29._0_10_ = Var28;
  auVar30[0xb] = uVar208;
  auVar30._0_11_ = auVar29;
  auVar31[0xc] = uVar265;
  auVar31._0_12_ = auVar30;
  auVar165[0xd] = uVar209;
  auVar165._0_13_ = auVar31;
  auVar165[0xe] = (char)uVar17;
  auVar165[0xf] = (char)((ulong)uVar17 >> 8);
  auVar164._14_2_ = auVar165._14_2_;
  auVar164[0xd] = (char)(uVar16 >> 8);
  auVar164._0_13_ = auVar31;
  auVar163._13_3_ = auVar164._13_3_;
  auVar163[0xc] = (char)uVar16;
  auVar163._0_12_ = auVar30;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162[0xb] = uVar449;
  auVar162._0_11_ = auVar29;
  auVar161._11_5_ = auVar162._11_5_;
  auVar161[10] = (char)uVar15;
  auVar161._0_10_ = Var28;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160[9] = uVar368;
  auVar160._0_9_ = Var27;
  auVar159._9_7_ = auVar160._9_7_;
  auVar159[8] = (char)uVar14;
  auVar159._0_8_ = uVar458;
  Var64 = CONCAT91(CONCAT81(auVar159._8_8_,(char)((ulong)uVar13 >> 8)),(char)uVar13);
  auVar107._2_10_ = Var64;
  auVar107[1] = (char)(uVar12 >> 8);
  auVar107[0] = (char)uVar12;
  auVar106._2_12_ = auVar107;
  auVar106[1] = uVar367;
  auVar106[0] = (char)uVar11;
  auVar158._0_2_ = (undefined2)uVar10;
  auVar158._2_14_ = auVar106;
  uVar7 = CONCAT44(auVar492._8_4_,auVar474._8_4_);
  Var27 = CONCAT18(local_108,uVar7);
  Var28 = CONCAT19(uStack_107,Var27);
  auVar33[10] = uStack_106;
  auVar33._0_10_ = Var28;
  auVar34[0xb] = uStack_105;
  auVar34._0_11_ = auVar33;
  auVar35[0xc] = uStack_104;
  auVar35._0_12_ = auVar34;
  auVar291[0xd] = uStack_103;
  auVar291._0_13_ = auVar35;
  auVar291[0xe] = uVar504;
  auVar291[0xf] = uVar214;
  auVar290._14_2_ = auVar291._14_2_;
  auVar290[0xd] = uVar323;
  auVar290._0_13_ = auVar35;
  auVar289._13_3_ = auVar290._13_3_;
  auVar289[0xc] = uVar451;
  auVar289._0_12_ = auVar34;
  auVar288._12_4_ = auVar289._12_4_;
  auVar288[0xb] = uVar213;
  auVar288._0_11_ = auVar33;
  auVar287._11_5_ = auVar288._11_5_;
  auVar287[10] = uVar450;
  auVar287._0_10_ = Var28;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286[9] = uVar267;
  auVar286._0_9_ = Var27;
  auVar285._9_7_ = auVar286._9_7_;
  auVar285[8] = uVar371;
  auVar285._0_8_ = uVar7;
  Var66 = CONCAT91(CONCAT81(auVar285._8_8_,(char)((ulong)uVar5 >> 0x18)),uVar370);
  auVar109._2_10_ = Var66;
  auVar109[1] = (char)((ulong)uVar4 >> 0x18);
  auVar109[0] = uVar420;
  auVar108._2_12_ = auVar109;
  auVar108[1] = (char)((ulong)uVar3 >> 0x18);
  auVar108[0] = uVar369;
  Var27 = CONCAT18((char)((ulong)uVar2 >> 0x28),auVar256._0_8_);
  Var28 = CONCAT19(uVar217,Var27);
  auVar37[10] = uVar294;
  auVar37._0_10_ = Var28;
  auVar38[0xb] = uVar218;
  auVar38._0_11_ = auVar37;
  auVar39[0xc] = uVar269;
  auVar39._0_12_ = auVar38;
  auVar262[0xd] = uVar219;
  auVar262._0_13_ = auVar39;
  auVar262[0xe] = uVar505;
  auVar262[0xf] = uVar506;
  auVar261._14_2_ = auVar262._14_2_;
  auVar261[0xd] = uVar455;
  auVar261._0_13_ = auVar39;
  auVar260._13_3_ = auVar261._13_3_;
  auVar260[0xc] = uVar453;
  auVar260._0_12_ = auVar38;
  auVar259._12_4_ = auVar260._12_4_;
  auVar259[0xb] = uVar454;
  auVar259._0_11_ = auVar37;
  auVar258._11_5_ = auVar259._11_5_;
  auVar258[10] = uVar452;
  auVar258._0_10_ = Var28;
  auVar257._10_6_ = auVar258._10_6_;
  auVar257[9] = uVar377;
  auVar257._0_9_ = Var27;
  auVar256._9_7_ = auVar257._9_7_;
  auVar256[8] = uVar374;
  Var74 = CONCAT91(CONCAT81(auVar256._8_8_,uVar376),uVar373);
  auVar111._2_10_ = Var74;
  auVar111[1] = uVar422;
  auVar111[0] = uVar421;
  auVar110._2_12_ = auVar111;
  auVar110[1] = uVar375;
  auVar110[0] = uVar372;
  auVar255._0_2_ = (undefined2)(uVar10 >> 0x20);
  auVar255._2_14_ = auVar110;
  uVar7 = CONCAT44(uVar168,uVar139);
  Var27 = CONCAT18(local_c8,uVar7);
  Var28 = CONCAT19(uStack_c7,Var27);
  auVar41[10] = uStack_c6;
  auVar41._0_10_ = Var28;
  auVar42[0xb] = uStack_c5;
  auVar42._0_11_ = auVar41;
  auVar43[0xc] = uStack_c4;
  auVar43._0_12_ = auVar42;
  auVar321[0xd] = uStack_c3;
  auVar321._0_13_ = auVar43;
  auVar321[0xe] = uVar507;
  auVar321[0xf] = uVar225;
  auVar320._14_2_ = auVar321._14_2_;
  auVar320[0xd] = uVar327;
  auVar320._0_13_ = auVar43;
  auVar319._13_3_ = auVar320._13_3_;
  auVar319[0xc] = uVar457;
  auVar319._0_12_ = auVar42;
  auVar318._12_4_ = auVar319._12_4_;
  auVar318[0xb] = uVar224;
  auVar318._0_11_ = auVar41;
  auVar317._11_5_ = auVar318._11_5_;
  auVar317[10] = uVar456;
  auVar317._0_10_ = Var28;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316[9] = uVar271;
  auVar316._0_9_ = Var27;
  auVar315._9_7_ = auVar316._9_7_;
  auVar315[8] = uVar380;
  auVar315._0_8_ = uVar7;
  Var95 = CONCAT91(CONCAT81(auVar315._8_8_,(char)((ulong)uVar5 >> 0x38)),uVar379);
  auVar113._2_10_ = Var95;
  auVar113[1] = (char)((ulong)uVar4 >> 0x38);
  auVar113[0] = uVar423;
  auVar112._2_12_ = auVar113;
  auVar112[1] = (char)((ulong)uVar3 >> 0x38);
  auVar112[0] = uVar378;
  auVar391._0_12_ = auVar158._0_12_;
  auVar391._12_2_ = (short)Var64;
  auVar391._14_2_ = (short)Var66;
  auVar390._12_4_ = auVar391._12_4_;
  auVar390._0_10_ = auVar158._0_10_;
  auVar390._10_2_ = auVar109._0_2_;
  auVar389._10_6_ = auVar390._10_6_;
  auVar389._0_8_ = auVar158._0_8_;
  auVar389._8_2_ = auVar107._0_2_;
  auVar114._4_8_ = auVar389._8_8_;
  auVar114._2_2_ = auVar108._0_2_;
  auVar114._0_2_ = auVar106._0_2_;
  auVar388._0_4_ = CONCAT22(CONCAT11((char)((ulong)uVar2 >> 0x18),uVar212),auVar158._0_2_);
  auVar388._4_12_ = auVar114;
  Var28 = CONCAT19(uStack_a7,CONCAT18(local_a8,uStack_b0));
  auVar45[10] = uStack_a6;
  auVar45._0_10_ = Var28;
  auVar46[0xb] = uStack_a5;
  auVar46._0_11_ = auVar45;
  auVar47[0xc] = uStack_a4;
  auVar47._0_12_ = auVar46;
  auVar205[0xd] = uStack_a3;
  auVar205._0_13_ = auVar47;
  auVar205[0xe] = (char)((ulong)uStack_b0 >> 0x38);
  auVar205[0xf] = uStack_a0._7_1_;
  auVar204._14_2_ = auVar205._14_2_;
  auVar204[0xd] = uStack_a0._6_1_;
  auVar204._0_13_ = auVar47;
  auVar203._13_3_ = auVar204._13_3_;
  auVar203[0xc] = (char)((ulong)uStack_b0 >> 0x30);
  auVar203._0_12_ = auVar46;
  auVar202._12_4_ = auVar203._12_4_;
  auVar202[0xb] = uStack_a0._5_1_;
  auVar202._0_11_ = auVar45;
  auVar201._11_5_ = auVar202._11_5_;
  auVar201[10] = (char)((ulong)uStack_b0 >> 0x28);
  auVar201._0_10_ = Var28;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200[9] = uStack_a0._4_1_;
  auVar200._0_9_ = CONCAT18(local_a8,uStack_b0);
  auVar199._9_7_ = auVar200._9_7_;
  auVar199[8] = (char)((ulong)uStack_b0 >> 0x20);
  auVar199._0_8_ = uStack_b0;
  Var64 = CONCAT91(CONCAT81(auVar199._8_8_,uStack_a0._3_1_),(char)((ulong)uStack_b0 >> 0x18));
  auVar116._2_10_ = Var64;
  auVar116[1] = uStack_a0._2_1_;
  auVar116[0] = (char)((ulong)uStack_b0 >> 0x10);
  auVar115._2_12_ = auVar116;
  auVar115[1] = uStack_a0._1_1_;
  auVar115[0] = (char)((ulong)uStack_b0 >> 8);
  auVar198._0_2_ = CONCAT11((undefined1)uStack_a0,(char)uStack_b0);
  auVar198._2_14_ = auVar115;
  auVar472._0_12_ = auVar255._0_12_;
  auVar472._12_2_ = (short)Var74;
  auVar472._14_2_ = (short)Var95;
  auVar471._12_4_ = auVar472._12_4_;
  auVar471._0_10_ = auVar255._0_10_;
  auVar471._10_2_ = auVar113._0_2_;
  auVar470._10_6_ = auVar471._10_6_;
  auVar470._0_8_ = auVar255._0_8_;
  auVar470._8_2_ = auVar111._0_2_;
  auVar117._4_8_ = auVar470._8_8_;
  auVar117._2_2_ = auVar112._0_2_;
  auVar117._0_2_ = auVar110._0_2_;
  Var27 = CONCAT18(local_88,CONCAT44(uStack_8c,uStack_90));
  Var28 = CONCAT19(uStack_87,Var27);
  auVar50[10] = uStack_86;
  auVar50._0_10_ = Var28;
  auVar51[0xb] = uStack_85;
  auVar51._0_11_ = auVar50;
  auVar52[0xc] = uStack_84;
  auVar52._0_12_ = auVar51;
  auVar419[0xd] = uStack_83;
  auVar419._0_13_ = auVar52;
  auVar419[0xe] = (char)((uint)uStack_8c >> 0x18);
  auVar419[0xf] = uStack_7c._3_1_;
  auVar418._14_2_ = auVar419._14_2_;
  auVar418[0xd] = uStack_7c._2_1_;
  auVar418._0_13_ = auVar52;
  auVar417._13_3_ = auVar418._13_3_;
  auVar417[0xc] = (char)((uint)uStack_8c >> 0x10);
  auVar417._0_12_ = auVar51;
  auVar416._12_4_ = auVar417._12_4_;
  auVar416[0xb] = uStack_7c._1_1_;
  auVar416._0_11_ = auVar50;
  auVar415._11_5_ = auVar416._11_5_;
  auVar415[10] = (char)((uint)uStack_8c >> 8);
  auVar415._0_10_ = Var28;
  auVar414._10_6_ = auVar415._10_6_;
  auVar414[9] = (undefined1)uStack_7c;
  auVar414._0_9_ = Var27;
  auVar413._9_7_ = auVar414._9_7_;
  auVar413[8] = (char)uStack_8c;
  auVar413._0_8_ = CONCAT44(uStack_8c,uStack_90);
  Var66 = CONCAT91(CONCAT81(auVar413._8_8_,uStack_80._3_1_),(char)((uint)uStack_90 >> 0x18));
  auVar119._2_10_ = Var66;
  auVar119[1] = uStack_80._2_1_;
  auVar119[0] = (char)((uint)uStack_90 >> 0x10);
  auVar118._2_12_ = auVar119;
  auVar118[1] = uStack_80._1_1_;
  auVar118[0] = (char)((uint)uStack_90 >> 8);
  Var28 = CONCAT19(uStack_67,CONCAT18(local_68,uStack_70));
  auVar54[10] = uStack_66;
  auVar54._0_10_ = Var28;
  auVar55[0xb] = uStack_65;
  auVar55._0_11_ = auVar54;
  auVar56[0xc] = uStack_64;
  auVar56._0_12_ = auVar55;
  auVar365[0xd] = uStack_63;
  auVar365._0_13_ = auVar56;
  auVar365[0xe] = (char)((ulong)uStack_70 >> 0x38);
  auVar365[0xf] = uStack_60._7_1_;
  auVar364._14_2_ = auVar365._14_2_;
  auVar364[0xd] = uStack_60._6_1_;
  auVar364._0_13_ = auVar56;
  auVar363._13_3_ = auVar364._13_3_;
  auVar363[0xc] = (char)((ulong)uStack_70 >> 0x30);
  auVar363._0_12_ = auVar55;
  auVar362._12_4_ = auVar363._12_4_;
  auVar362[0xb] = uStack_60._5_1_;
  auVar362._0_11_ = auVar54;
  auVar361._11_5_ = auVar362._11_5_;
  auVar361[10] = (char)((ulong)uStack_70 >> 0x28);
  auVar361._0_10_ = Var28;
  auVar360._10_6_ = auVar361._10_6_;
  auVar360[9] = uStack_60._4_1_;
  auVar360._0_9_ = CONCAT18(local_68,uStack_70);
  auVar359._9_7_ = auVar360._9_7_;
  auVar359[8] = (char)((ulong)uStack_70 >> 0x20);
  auVar359._0_8_ = uStack_70;
  Var74 = CONCAT91(CONCAT81(auVar359._8_8_,uStack_60._3_1_),(char)((ulong)uStack_70 >> 0x18));
  auVar121._2_10_ = Var74;
  auVar121[1] = uStack_60._2_1_;
  auVar121[0] = (char)((ulong)uStack_70 >> 0x10);
  auVar120._2_12_ = auVar121;
  auVar120[1] = uStack_60._1_1_;
  auVar120[0] = (char)((ulong)uStack_70 >> 8);
  auVar358._0_2_ = CONCAT11((undefined1)uStack_60,(char)uStack_70);
  auVar358._2_14_ = auVar120;
  auVar491._0_12_ = auVar198._0_12_;
  auVar491._12_2_ = (short)Var64;
  auVar491._14_2_ = (short)Var66;
  auVar490._12_4_ = auVar491._12_4_;
  auVar490._0_10_ = auVar198._0_10_;
  auVar490._10_2_ = auVar119._0_2_;
  auVar489._10_6_ = auVar490._10_6_;
  auVar489._0_8_ = auVar198._0_8_;
  auVar489._8_2_ = auVar116._0_2_;
  auVar122._4_8_ = auVar489._8_8_;
  auVar122._2_2_ = auVar118._0_2_;
  auVar122._0_2_ = auVar115._0_2_;
  auVar488._0_4_ = CONCAT22(CONCAT11((undefined1)uStack_80,(char)uStack_90),auVar198._0_2_);
  auVar488._4_12_ = auVar122;
  Var27 = CONCAT18(local_48,CONCAT44(uStack_4c,uStack_50));
  Var28 = CONCAT19(uStack_47,Var27);
  auVar59[10] = uStack_46;
  auVar59._0_10_ = Var28;
  auVar60[0xb] = uStack_45;
  auVar60._0_11_ = auVar59;
  auVar61[0xc] = uStack_44;
  auVar61._0_12_ = auVar60;
  auVar448[0xd] = uStack_43;
  auVar448._0_13_ = auVar61;
  auVar448[0xe] = (char)((uint)uStack_4c >> 0x18);
  auVar448[0xf] = (char)((uint)uStack_3c >> 0x18);
  auVar447._14_2_ = auVar448._14_2_;
  auVar447[0xd] = (char)((uint)uStack_3c >> 0x10);
  auVar447._0_13_ = auVar61;
  auVar446._13_3_ = auVar447._13_3_;
  auVar446[0xc] = (char)((uint)uStack_4c >> 0x10);
  auVar446._0_12_ = auVar60;
  auVar445._12_4_ = auVar446._12_4_;
  auVar445[0xb] = (char)((uint)uStack_3c >> 8);
  auVar445._0_11_ = auVar59;
  auVar444._11_5_ = auVar445._11_5_;
  auVar444[10] = (char)((uint)uStack_4c >> 8);
  auVar444._0_10_ = Var28;
  auVar443._10_6_ = auVar444._10_6_;
  auVar443[9] = (char)uStack_3c;
  auVar443._0_9_ = Var27;
  auVar442._9_7_ = auVar443._9_7_;
  auVar442[8] = (char)uStack_4c;
  auVar442._0_8_ = CONCAT44(uStack_4c,uStack_50);
  Var28 = CONCAT91(CONCAT81(auVar442._8_8_,(char)((uint)uStack_40 >> 0x18)),
                   (char)((uint)uStack_50 >> 0x18));
  auVar124._2_10_ = Var28;
  auVar124[1] = (char)((uint)uStack_40 >> 0x10);
  auVar124[0] = (char)((uint)uStack_50 >> 0x10);
  auVar123._2_12_ = auVar124;
  auVar123[1] = (char)((uint)uStack_40 >> 8);
  auVar123[0] = (char)((uint)uStack_50 >> 8);
  auVar503._0_12_ = auVar358._0_12_;
  auVar503._12_2_ = (short)Var74;
  auVar503._14_2_ = (short)Var28;
  auVar502._12_4_ = auVar503._12_4_;
  auVar502._0_10_ = auVar358._0_10_;
  auVar502._10_2_ = auVar124._0_2_;
  auVar501._10_6_ = auVar502._10_6_;
  auVar501._0_8_ = auVar358._0_8_;
  auVar501._8_2_ = auVar121._0_2_;
  auVar125._4_8_ = auVar501._8_8_;
  auVar125._2_2_ = auVar123._0_2_;
  auVar125._0_2_ = auVar120._0_2_;
  auVar509._0_8_ = auVar388._0_8_;
  auVar509._8_4_ = auVar114._0_4_;
  auVar509._12_4_ = auVar117._0_4_;
  auVar473._0_8_ = auVar488._0_8_;
  auVar473._8_4_ = auVar122._0_4_;
  auVar473._12_4_ = auVar125._0_4_;
  *(ulong *)(s + lVar137 * 8 + -8) =
       CONCAT44(CONCAT22(CONCAT11((char)((ulong)uVar2 >> 0x38),uVar223),auVar255._0_2_),
                auVar388._0_4_);
  *(ulong *)(s + lVar137 * 8 + -8 + 8) =
       CONCAT44(CONCAT22(CONCAT11((char)uStack_40,(char)uStack_50),auVar358._0_2_),auVar488._0_4_);
  *(long *)(s + lVar137 + lVar136) = auVar509._8_8_;
  *(long *)(s + lVar137 + lVar136 + 8) = auVar473._8_8_;
  puVar1 = s + lVar137 * 2 + lVar136;
  *(int *)puVar1 = auVar389._8_4_;
  *(int *)(puVar1 + 4) = auVar470._8_4_;
  *(int *)(puVar1 + 8) = auVar489._8_4_;
  *(int *)(puVar1 + 0xc) = auVar501._8_4_;
  lVar22 = lVar22 + lVar136;
  *(undefined4 *)(s + lVar22 + 8) = auVar390._12_4_;
  *(undefined4 *)(s + lVar22 + 0xc) = auVar471._12_4_;
  *(undefined4 *)(s + lVar22 + 0x10) = auVar490._12_4_;
  *(undefined4 *)(s + lVar22 + 0x14) = auVar502._12_4_;
  uVar139 = CONCAT22(auVar285._8_2_,auVar159._8_2_);
  auVar141._0_8_ = CONCAT26(auVar287._10_2_,CONCAT24(auVar161._10_2_,uVar139));
  auVar141._8_2_ = auVar163._12_2_;
  auVar141._10_2_ = auVar289._12_2_;
  auVar166._12_2_ = auVar164._14_2_;
  auVar166._0_12_ = auVar141;
  auVar166._14_2_ = auVar290._14_2_;
  uVar138 = CONCAT22(auVar315._8_2_,auVar256._8_2_);
  auVar228._0_8_ = CONCAT26(auVar317._10_2_,CONCAT24(auVar258._10_2_,uVar138));
  auVar228._8_2_ = auVar260._12_2_;
  auVar228._10_2_ = auVar319._12_2_;
  auVar263._12_2_ = auVar261._14_2_;
  auVar263._0_12_ = auVar228;
  auVar263._14_2_ = auVar320._14_2_;
  uVar168 = CONCAT22(auVar413._8_2_,auVar199._8_2_);
  auVar171._0_8_ = CONCAT26(auVar415._10_2_,CONCAT24(auVar201._10_2_,uVar168));
  auVar171._8_2_ = auVar203._12_2_;
  auVar171._10_2_ = auVar417._12_2_;
  auVar206._12_2_ = auVar204._14_2_;
  auVar206._0_12_ = auVar171;
  auVar206._14_2_ = auVar418._14_2_;
  uVar167 = CONCAT22(auVar442._8_2_,auVar359._8_2_);
  auVar331._0_8_ = CONCAT26(auVar444._10_2_,CONCAT24(auVar361._10_2_,uVar167));
  auVar331._8_2_ = auVar363._12_2_;
  auVar331._10_2_ = auVar446._12_2_;
  auVar366._12_2_ = auVar364._14_2_;
  auVar366._0_12_ = auVar331;
  auVar366._14_2_ = auVar447._14_2_;
  auVar292._8_4_ = (int)((ulong)auVar141._0_8_ >> 0x20);
  auVar292._0_8_ = auVar141._0_8_;
  auVar292._12_4_ = (int)((ulong)auVar228._0_8_ >> 0x20);
  auVar264._8_4_ = (int)((ulong)auVar171._0_8_ >> 0x20);
  auVar264._0_8_ = auVar171._0_8_;
  auVar264._12_4_ = (int)((ulong)auVar331._0_8_ >> 0x20);
  *(ulong *)(s + lVar137 * 4 + lVar136) = CONCAT44(uVar138,uVar139);
  *(ulong *)(s + lVar137 * 4 + lVar136 + 8) = CONCAT44(uVar167,uVar168);
  *(long *)(s + lVar23 + lVar136) = auVar292._8_8_;
  *(long *)(s + lVar23 + lVar136 + 8) = auVar264._8_8_;
  puVar1 = s + lVar24 + lVar136;
  *(int *)puVar1 = auVar141._8_4_;
  *(int *)(puVar1 + 4) = auVar228._8_4_;
  *(int *)(puVar1 + 8) = auVar171._8_4_;
  *(int *)(puVar1 + 0xc) = auVar331._8_4_;
  lVar25 = lVar25 + lVar136;
  *(int *)(s + lVar25 + 8) = auVar166._12_4_;
  *(int *)(s + lVar25 + 0xc) = auVar263._12_4_;
  *(int *)(s + lVar25 + 0x10) = auVar206._12_4_;
  *(int *)(s + lVar25 + 0x14) = auVar366._12_4_;
  return;
}

Assistant:

void aom_lpf_vertical_14_quad_sse2(unsigned char *s, int pitch,
                                   const uint8_t *_blimit0,
                                   const uint8_t *_limit0,
                                   const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[256]);

  // Transpose 16x16
  transpose_16x8(s - 8, s - 8 + 8 * pitch, pitch, t_dst, 16);
  transpose_16x8(s, s + 8 * pitch, pitch, t_dst + 8 * 16, 16);

  // Loop filtering
  aom_lpf_horizontal_14_quad(t_dst + 8 * 16, 16, _blimit0, _limit0, _thresh0);

  // Transpose back
  transpose_16x8(t_dst, t_dst + 8 * 16, 16, s - 8, pitch);
  transpose_16x8(t_dst + 8, t_dst + 8 + 8 * 16, 16, s - 8 + 8 * pitch, pitch);
}